

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O0

bool OutputBin(FILE *file,char *buf,uint startIndex,uint stopIndex)

{
  int iVar1;
  size_t sVar2;
  undefined4 local_134;
  uint local_130;
  uint convertedByte;
  uint i;
  uint outBufCount;
  char outBuf [256];
  char hexNumber [3];
  bool success;
  uint stopIndex_local;
  uint startIndex_local;
  char *buf_local;
  FILE *file_local;
  
  outBuf[0xff] = '\x01';
  outBuf[0xfe] = '\0';
  convertedByte = 0;
  local_130 = startIndex;
  do {
    if (stopIndex <= local_130) {
LAB_0030fc43:
      if ((outBuf[0xff] & 1U) != 0) {
        sVar2 = fwrite(&i,1,(ulong)convertedByte,(FILE *)file);
        outBuf[0xff] = sVar2 == convertedByte;
      }
      return (bool)(outBuf[0xff] & 1);
    }
    outBuf[0xfc] = buf[local_130];
    outBuf[0xfd] = buf[local_130 + 1];
    local_134 = 0;
    iVar1 = __isoc99_sscanf(outBuf + 0xfc,"%x",&local_134);
    if (iVar1 != 1) {
      outBuf[0xff] = '\0';
      goto LAB_0030fc43;
    }
    *(char *)((long)&i + (ulong)convertedByte) = (char)local_134;
    convertedByte = convertedByte + 1;
    local_130 = local_130 + 2;
  } while( true );
}

Assistant:

static bool OutputBin(FILE* file, const char* buf, unsigned int startIndex,
                      unsigned int stopIndex)
{
  bool success = true;
  char hexNumber[3];
  hexNumber[2] = '\0';
  char outBuf[256];
  unsigned int outBufCount = 0;
  for (unsigned int i = startIndex; i < stopIndex; i += 2) {
    hexNumber[0] = buf[i];
    hexNumber[1] = buf[i + 1];
    unsigned int convertedByte = 0;
    if (sscanf(hexNumber, "%x", &convertedByte) != 1) {
      success = false;
      break;
    }
    outBuf[outBufCount] = static_cast<char>(convertedByte & 0xff);
    outBufCount++;
  }
  if (success) {
    success = (fwrite(outBuf, 1, outBufCount, file) == outBufCount);
  }
  return success;
}